

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureFunctionTests.cpp
# Opt level: O0

void __thiscall
vkt::sr::anon_unknown_0::ShaderTextureFunctionCase::ShaderTextureFunctionCase
          (ShaderTextureFunctionCase *this,TestContext *testCtx,string *name,string *desc,
          TextureLookupSpec *lookup,TextureSpec *texture,TexEvalFunc evalFunc,bool isVertexCase)

{
  undefined8 uVar1;
  undefined3 uVar2;
  CompareMode CVar3;
  WrapMode WVar4;
  FilterMode FVar5;
  FilterMode FVar6;
  float fVar7;
  int iVar8;
  int iVar9;
  WrapMode WVar10;
  WrapMode WVar11;
  TextureType TVar12;
  deUint32 dVar13;
  int iVar14;
  int iVar15;
  TexLookupEvaluator *this_00;
  bool isVertexCase_local;
  TextureSpec *texture_local;
  TextureLookupSpec *lookup_local;
  string *desc_local;
  string *name_local;
  TestContext *testCtx_local;
  ShaderTextureFunctionCase *this_local;
  
  (this->super_ShaderRenderCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ShaderTextureFunctionCase_016659d8;
  this_00 = (TexLookupEvaluator *)operator_new(0x20);
  TexLookupEvaluator::TexLookupEvaluator(this_00,evalFunc,&this->m_lookupParams);
  ShaderRenderCase::ShaderRenderCase
            (&this->super_ShaderRenderCase,testCtx,name,desc,isVertexCase,(ShaderEvaluator *)this_00
             ,(UniformSetup *)0x0,(AttributeSetupFunc)0x0);
  (this->super_ShaderRenderCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ShaderTextureFunctionCase_016659d8;
  TextureLookupSpec::TextureLookupSpec(&this->m_lookupSpec,lookup);
  (this->m_textureSpec).sampler.depthStencilMode = (texture->sampler).depthStencilMode;
  uVar1 = *(undefined8 *)((long)&(texture->sampler).borderColor.v + 0xc);
  *(undefined8 *)((long)&(this->m_textureSpec).sampler.borderColor.v + 4) =
       *(undefined8 *)((long)&(texture->sampler).borderColor.v + 4);
  *(undefined8 *)((long)&(this->m_textureSpec).sampler.borderColor.v + 0xc) = uVar1;
  TVar12 = texture->type;
  dVar13 = texture->format;
  iVar14 = texture->width;
  iVar15 = texture->height;
  iVar8 = texture->depth;
  iVar9 = texture->numLevels;
  WVar10 = (texture->sampler).wrapS;
  WVar11 = (texture->sampler).wrapT;
  WVar4 = (texture->sampler).wrapR;
  FVar5 = (texture->sampler).minFilter;
  FVar6 = (texture->sampler).magFilter;
  fVar7 = (texture->sampler).lodThreshold;
  uVar2 = *(undefined3 *)&(texture->sampler).field_0x19;
  CVar3 = (texture->sampler).compare;
  uVar1 = *(undefined8 *)&(texture->sampler).compareChannel;
  (this->m_textureSpec).sampler.normalizedCoords = (texture->sampler).normalizedCoords;
  *(undefined3 *)&(this->m_textureSpec).sampler.field_0x19 = uVar2;
  (this->m_textureSpec).sampler.compare = CVar3;
  *(undefined8 *)&(this->m_textureSpec).sampler.compareChannel = uVar1;
  (this->m_textureSpec).sampler.wrapR = WVar4;
  (this->m_textureSpec).sampler.minFilter = FVar5;
  (this->m_textureSpec).sampler.magFilter = FVar6;
  (this->m_textureSpec).sampler.lodThreshold = fVar7;
  (this->m_textureSpec).depth = iVar8;
  (this->m_textureSpec).numLevels = iVar9;
  (this->m_textureSpec).sampler.wrapS = WVar10;
  (this->m_textureSpec).sampler.wrapT = WVar11;
  (this->m_textureSpec).type = TVar12;
  (this->m_textureSpec).format = dVar13;
  (this->m_textureSpec).width = iVar14;
  (this->m_textureSpec).height = iVar15;
  TexLookupParams::TexLookupParams(&this->m_lookupParams);
  initShaderSources(this);
  return;
}

Assistant:

ShaderTextureFunctionCase::ShaderTextureFunctionCase (tcu::TestContext&				testCtx,
													  const std::string&			name,
													  const std::string&			desc,
													  const TextureLookupSpec&		lookup,
													  const TextureSpec&			texture,
													  TexEvalFunc					evalFunc,
													  bool							isVertexCase)
	: ShaderRenderCase		(testCtx, name, desc, isVertexCase, new TexLookupEvaluator(evalFunc, m_lookupParams), NULL, NULL)
	, m_lookupSpec			(lookup)
	, m_textureSpec			(texture)
{
	initShaderSources();
}